

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O0

Float pbrt::HenyeyGreenstein(Float cosTheta,Float g)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint in_XMM0_Da;
  float fVar3;
  float in_XMM1_Da;
  Float denom;
  
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_XMM1_Da),ZEXT416((uint)in_XMM1_Da),
                           SUB6416(ZEXT464(0x3f800000),0));
  auVar1 = vfmadd213ss_fma(ZEXT416(in_XMM0_Da),ZEXT416((uint)(in_XMM1_Da * 2.0)),auVar1);
  auVar2 = vfmadd213ss_fma(ZEXT416((uint)in_XMM1_Da),ZEXT416((uint)-in_XMM1_Da),
                           SUB6416(ZEXT464(0x3f800000),0));
  fVar3 = SafeSqrt(0.0);
  return (auVar2._0_4_ * 0.07957747) / (auVar1._0_4_ * fVar3);
}

Assistant:

PBRT_CPU_GPU
inline Float HenyeyGreenstein(Float cosTheta, Float g) {
    Float denom = 1 + g * g + 2 * g * cosTheta;
    return Inv4Pi * (1 - g * g) / (denom * SafeSqrt(denom));
}